

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O0

bool __thiscall wasm::RemoveUnusedBrs::optimizeGC(RemoveUnusedBrs *this,Function *func)

{
  undefined8 func_00;
  bool bVar1;
  Module *pMVar2;
  PassOptions *passOptions;
  ReFinalize local_280;
  undefined1 local_108 [8];
  Optimizer optimizer;
  Function *func_local;
  RemoveUnusedBrs *this_local;
  
  optimizer._224_8_ = func;
  pMVar2 = Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                       ).
                       super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                       .
                       super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                     );
  bVar1 = FeatureSet::hasGC(&pMVar2->features);
  if (bVar1) {
    passOptions = Pass::getPassOptions((Pass *)this);
    optimizeGC(wasm::Function*)::Optimizer::Optimizer(wasm::PassOptions__
              ((Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_> *)local_108,passOptions);
    pMVar2 = Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::getModule
                       (&(this->
                         super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                         ).
                         super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                         .
                         super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                       );
    Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>::setModule
              ((Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_> *)local_108,pMVar2);
    Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>::doWalkFunction
              ((Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_> *)local_108,
               (Function *)optimizer._224_8_);
    this_local._7_1_ = ((byte)optimizer.passOptions & 1) != 0;
    if (this_local._7_1_) {
      ReFinalize::ReFinalize(&local_280);
      func_00 = optimizer._224_8_;
      pMVar2 = Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::getModule
                         (&(this->
                           super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                           ).
                           super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                           .
                           super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                         );
      Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::
      walkFunctionInModule
                (&local_280.
                  super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                  .
                  super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                  .super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>,
                 (Function *)func_00,pMVar2);
      ReFinalize::~ReFinalize(&local_280);
    }
    optimizeGC::Optimizer::~Optimizer((Optimizer *)local_108);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool optimizeGC(Function* func) {
    if (!getModule()->features.hasGC()) {
      return false;
    }

    struct Optimizer : public PostWalker<Optimizer> {
      PassOptions& passOptions;
      bool worked = false;

      Optimizer(PassOptions& passOptions) : passOptions(passOptions) {}

      void visitBrOn(BrOn* curr) {
        // Ignore unreachable BrOns which we cannot improve anyhow. Note that
        // we must check the ref field manually, as we may be changing types as
        // we go here. (Another option would be to use a TypeUpdater here
        // instead of calling ReFinalize at the very end, but that would be more
        // complex and slower.)
        if (curr->type == Type::unreachable ||
            curr->ref->type == Type::unreachable) {
          return;
        }

        Builder builder(*getModule());

        Type refType =
          Properties::getFallthroughType(curr->ref, passOptions, *getModule());
        if (refType == Type::unreachable) {
          // Leave this to DCE.
          return;
        }
        assert(refType.isRef());

        // When we optimize based on all the fallthrough type information
        // available, we may need to insert a cast to maintain validity. For
        // example, in this case we know the cast will succeed, but it would be
        // invalid to send curr->ref directly:
        //
        //   (br_on_cast $l anyref i31ref
        //     (block (result anyref)
        //       (ref.i31 ...)))
        //
        // We could just always do the cast and leave removing the casts to
        // OptimizeInstructions, but it's simple enough to avoid unnecessary
        // casting here.
        auto maybeCast = [&](Expression* expr, Type type) -> Expression* {
          assert(expr->type.isRef() && type.isRef());
          if (Type::isSubType(expr->type, type)) {
            return expr;
          }
          if (type.isNonNullable() && expr->type.isNullable() &&
              Type::isSubType(expr->type.with(NonNullable), type)) {
            return builder.makeRefAs(RefAsNonNull, expr);
          }
          return builder.makeRefCast(expr, type);
        };

        if (curr->op == BrOnNull) {
          if (refType.isNull()) {
            // The branch will definitely be taken.
            replaceCurrent(builder.makeSequence(builder.makeDrop(curr->ref),
                                                builder.makeBreak(curr->name)));
            worked = true;
            return;
          }
          if (refType.isNonNullable()) {
            // The branch will definitely not be taken.
            replaceCurrent(maybeCast(curr->ref, curr->type));
            worked = true;
            return;
          }
          return;
        }

        if (curr->op == BrOnNonNull) {
          if (refType.isNull()) {
            // Definitely not taken.
            replaceCurrent(builder.makeDrop(curr->ref));
            worked = true;
            return;
          }
          if (refType.isNonNullable()) {
            // Definitely taken.
            replaceCurrent(builder.makeBreak(
              curr->name, maybeCast(curr->ref, curr->getSentType())));
            worked = true;
            return;
          }
          return;
        }

        // Improve the cast target type as much as possible given what we know
        // about the input. Unlike in BrOn::finalize(), we consider type
        // information from all the fallthrough values here. We can continue to
        // further optimizations after this, and those optimizations might even
        // benefit from this improvement.
        auto glb = Type::getGreatestLowerBound(curr->castType, refType);
        if (!curr->castType.isExact()) {
          // When custom descriptors is not enabled, nontrivial exact casts are
          // not allowed.
          glb = glb.withInexactIfNoCustomDescs(getModule()->features);
        }
        if (curr->op == BrOnCastFail) {
          // BrOnCastFail sends the input type, with adjusted nullability. The
          // input heap type makes sense for the branch target, and we will not
          // change it anyhow, but we need to be careful with nullability: if
          // the cast type was nullable, then we were sending a non-nullable
          // value to the branch, and if we refined the cast type to non-
          // nullable, we would no longer be doing that. In other words, we must
          // not refine the nullability, as that would *un*refine the send type.
          if (curr->castType.isNullable() && glb.isNonNullable()) {
            glb = glb.with(Nullable);
          }
        }
        if (glb != Type::unreachable && glb != curr->castType) {
          curr->castType = glb;
          auto oldType = curr->type;
          curr->finalize();
          worked = true;

          // We refined the castType, which may *un*-refine the BrOn itself.
          // Imagine the castType was nullable before, then nulls would go on
          // the branch, and so the BrOn could only flow out a non-nullable
          // value, and that was its type. If we refine the castType to be
          // non-nullable then nulls no longer go through, making the BrOn
          // itself nullable. This should not normally happen, but can occur
          // because we look at the fallthrough of the ref:
          //
          //   (br_on_cast
          //     (local.tee $unrefined
          //       (refined
          //
          // That is, we may see a more refined type for our GLB computation
          // than the wasm type system does, if a local.tee or such ends up
          // unrefining the type.
          //
          // To check for this and fix it, see if we need a cast in order to be
          // a subtype of the old type.
          auto* rep = maybeCast(curr, oldType);
          if (rep != curr) {
            replaceCurrent(rep);
            // Exit after doing so, leaving further work for other cycles.
            return;
          }
        }

        // Depending on what we know about the cast results, we may be able to
        // optimize.
        auto result = GCTypeUtils::evaluateCastCheck(refType, curr->castType);
        if (curr->op == BrOnCastFail) {
          result = GCTypeUtils::flipEvaluationResult(result);
        }

        switch (result) {
          case GCTypeUtils::Unknown:
            // Anything could happen, so we cannot optimize.
            return;
          case GCTypeUtils::Success: {
            replaceCurrent(builder.makeBreak(
              curr->name, maybeCast(curr->ref, curr->getSentType())));
            worked = true;
            return;
          }
          case GCTypeUtils::Failure: {
            replaceCurrent(maybeCast(curr->ref, curr->type));
            worked = true;
            return;
          }
          case GCTypeUtils::SuccessOnlyIfNull: {
            // TODO: optimize this case using the following replacement, which
            // avoids using any scratch locals and only does a single null
            // check, but does require generating a fresh label:
            //
            //   (br_on_cast $l (ref null $X) (ref null $Y)
            //     (...)
            //   )
            //     =>
            //   (block $l' (result (ref $X))
            //     (br_on_non_null $l' ;; reuses `curr`
            //       (...)
            //     )
            //     (br $l
            //       (ref.null bot<X>)
            //     )
            //   )
            return;
          }
          case GCTypeUtils::SuccessOnlyIfNonNull: {
            // Perform this replacement:
            //
            //   (br_on_cast $l (ref null $X') (ref $X))
            //     (...)
            //   )
            //     =>
            //   (block (result (ref bot<X>))
            //     (br_on_non_null $l ;; reuses `curr`
            //       (...)
            //     (ref.null bot<X>)
            //   )
            curr->ref = maybeCast(
              curr->ref, Type(curr->getSentType().getHeapType(), Nullable));
            curr->op = BrOnNonNull;
            curr->castType = Type::none;
            curr->type = Type::none;

            assert(curr->ref->type.isRef());
            auto* refNull = builder.makeRefNull(curr->ref->type.getHeapType());
            replaceCurrent(builder.makeBlock({curr, refNull}, refNull->type));
            worked = true;
            return;
          }
          case GCTypeUtils::Unreachable: {
            // The cast is never executed, possibly because its input type is
            // uninhabitable. Replace it with unreachable.
            auto* drop = builder.makeDrop(curr->ref);
            auto* unreachable = ExpressionManipulator::unreachable(curr);
            replaceCurrent(builder.makeBlock({drop, unreachable}));
            worked = true;
            return;
          }
        }
      }
    } optimizer(getPassOptions());

    optimizer.setModule(getModule());
    optimizer.doWalkFunction(func);

    // If we removed any BrOn instructions, that might affect the reachability
    // of the things they used to break to, so update types.
    if (optimizer.worked) {
      ReFinalize().walkFunctionInModule(func, getModule());
      return true;
    }
    return false;
  }